

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  basic_format_specs<char> *pbVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  char *pcVar9;
  buffer_appender<char> bVar10;
  uint uVar11;
  uint uVar12;
  _Alloc_hider _Var13;
  _Alloc_hider _Var14;
  size_type sVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  char *pcVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  buffer<char> *buf;
  string groups;
  char digits [40];
  string local_2a8;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *local_288;
  long local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_2a8,(locale_ref)(this->locale).locale_);
  if (local_2a8._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar7 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar7 == '\0') {
      on_dec(this);
    }
    else {
      uVar12 = this->abs_value;
      uVar8 = 0x1f;
      if ((uVar12 | 1) != 0) {
        for (; (uVar12 | 1) >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar4 = *(ushort *)(bsr2log10(int)::data + (ulong)uVar8 * 2);
      uVar20 = (uint)uVar4 -
               (uint)(uVar12 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                        (ulong)uVar4 * 4));
      iVar23 = -(uint)(uVar12 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                         (ulong)uVar4 * 4));
      pcVar9 = local_2a8._M_dataplus._M_p + local_2a8._M_string_length;
      _Var14._M_p = local_2a8._M_dataplus._M_p;
      uVar8 = uVar20;
      uVar11 = uVar20;
      if (local_2a8._M_string_length != 0) {
        _Var13._M_p = local_2a8._M_dataplus._M_p;
        sVar15 = local_2a8._M_string_length;
        uVar21 = uVar20;
        do {
          cVar2 = *_Var13._M_p;
          uVar18 = uVar11 - (int)cVar2;
          _Var14._M_p = _Var13._M_p;
          uVar8 = uVar21;
          if ((uVar18 == 0 || (int)uVar11 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          uVar21 = uVar21 + 1;
          _Var13._M_p = _Var13._M_p + 1;
          sVar15 = sVar15 - 1;
          _Var14._M_p = pcVar9;
          uVar8 = (int)local_2a8._M_string_length + iVar23 + (uint)uVar4;
          uVar11 = uVar18;
        } while (sVar15 != 0);
      }
      if (_Var14._M_p == pcVar9) {
        uVar8 = (int)(uVar11 - 1) / (int)pcVar9[-1] + uVar8;
      }
      pcVar9 = local_278 + (int)uVar20;
      uVar11 = uVar12;
      if (99 < uVar12) {
        do {
          uVar12 = uVar11 / 100;
          *(undefined2 *)(pcVar9 + -2) =
               *(undefined2 *)(&basic_data<void>::digits + (ulong)(uVar11 % 100) * 2);
          pcVar9 = pcVar9 + -2;
          bVar6 = 9999 < uVar11;
          uVar11 = uVar11 / 100;
        } while (bVar6);
      }
      if (uVar12 < 10) {
        pcVar9[-1] = (byte)uVar12 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar9 + -2) =
             *(undefined2 *)(&basic_data<void>::digits + (ulong)uVar12 * 2);
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0014acc8;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar8 = uVar8 + this->prefix_size;
      uVar22 = (ulong)uVar8;
      if (500 < uVar8) {
        basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar22);
      }
      pcVar9 = local_248.super_buffer<char>.ptr_;
      local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
      if (uVar22 <= local_248.super_buffer<char>.capacity_) {
        local_248.super_buffer<char>.size_ = uVar22;
      }
      local_280 = (long)(int)uVar8;
      pcVar19 = local_248.super_buffer<char>.ptr_ + local_280 + -1;
      if (1 < (int)uVar20) {
        uVar16 = (ulong)uVar20;
        iVar17 = iVar23 + (uint)uVar4 + 1;
        iVar23 = 0;
        _Var14._M_p = local_2a8._M_dataplus._M_p;
        do {
          uVar16 = uVar16 - 1;
          pcVar1 = pcVar19 + -1;
          *pcVar19 = local_278[uVar16 & 0xffffffff];
          cVar2 = *_Var14._M_p;
          if ('\0' < cVar2) {
            iVar23 = iVar23 + 1;
            if ((cVar2 != '\x7f') && (iVar23 % (int)cVar2 == 0)) {
              if (_Var14._M_p + 1 != local_2a8._M_dataplus._M_p + local_2a8._M_string_length) {
                iVar23 = 0;
                _Var14._M_p = _Var14._M_p + 1;
              }
              pcVar19[-1] = cVar7;
              pcVar1 = pcVar19 + -2;
            }
          }
          pcVar19 = pcVar1;
          iVar17 = iVar17 + -1;
        } while (2 < iVar17);
      }
      *pcVar19 = local_278[0];
      if (this->prefix_size != 0) {
        pcVar19[-1] = '-';
      }
      pbVar5 = this->specs;
      uVar16 = 0;
      if (uVar22 <= (uint)pbVar5->width) {
        uVar16 = (uint)pbVar5->width - uVar22;
      }
      bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                       (ulong)((byte)pbVar5->field_0x9 & 0xf));
      local_288 = this;
      if (*(ulong *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                           container + 0x18) <
          *(long *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                          container + 0x10) + uVar22 + (pbVar5->fill).size_ * uVar16) {
        (*(code *)**(undefined8 **)
                    bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      uVar22 = uVar16 >> (bVar3 & 0x3f);
      bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar10,uVar22,&pbVar5->fill);
      bVar10 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                         (pcVar9,pcVar9 + local_280,bVar10);
      bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>
                         (bVar10,uVar16 - uVar22,&pbVar5->fill);
      (local_288->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
        operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }